

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::ArraySizeMethod::ArraySizeMethod
          (ArraySizeMethod *this,Builtins *builtins,KnownSystemName knownNameId)

{
  undefined4 in_EDX;
  undefined2 uVar1;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *in_RDI;
  Type *returnType;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
  *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  undefined8 uVar2;
  SimpleSystemSubroutine *this_00;
  
  uVar1 = (undefined2)((uint)in_EDX >> 0x10);
  uVar2._0_4_ = Unknown;
  uVar2._4_4_ = 0;
  this_00 = (SimpleSystemSubroutine *)0x0;
  returnType = (Type *)&stack0xffffffffffffffc8;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)0xac8304
            );
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (this_00,SUB84(uVar2,4),(SubroutineKind)uVar2,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,returnType,SUB21((ushort)uVar1 >> 8,0),SUB21(uVar1,0));
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::~vector(in_RDI);
  (in_RDI->super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__ArraySizeMethod_0100e078;
  return;
}

Assistant:

ArraySizeMethod(const Builtins& builtins, KnownSystemName knownNameId) :
        SimpleSystemSubroutine(knownNameId, SubroutineKind::Function, 0, {}, builtins.intType,
                               true) {}